

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<Elf64_Sym,_pstack::Elf::Section> *t)

{
  element_type *peVar1;
  JObject *pJVar2;
  ostream *poVar3;
  char local_86 [2];
  uint local_84;
  char local_7f [3];
  uint local_7c;
  char local_77 [15];
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  JObject local_38;
  Section *local_28;
  Section *symStrings;
  Section *sec;
  JSON<Elf64_Sym,_pstack::Elf::Section> *t_local;
  ostream *os_local;
  
  symStrings = t->context;
  sec = (Section *)t;
  t_local = (JSON<Elf64_Sym,_pstack::Elf::Section> *)os;
  local_28 = Elf::Object::getLinkedSection(symStrings->elf,symStrings);
  JObject::JObject(&local_38,(ostream *)t_local);
  Elf::Section::io((Section *)local_68);
  peVar1 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  (*peVar1->_vptr_Reader[7])
            (local_68 + 0x10,peVar1,
             (ulong)*(uint *)&((sec->io_).
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_Reader);
  local_77[2] = 0;
  pJVar2 = JObject::field<char[5],std::__cxx11::string,char>
                     (&local_38,(char (*) [5])0x2a7955,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_68 + 0x10),local_77 + 2);
  local_77[1] = 0;
  pJVar2 = JObject::field<char[6],unsigned_long,char>
                     (pJVar2,(char (*) [6])0x2a8340,
                      (unsigned_long *)
                      &((sec->io_).
                        super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->super_enable_shared_from_this<pstack::Reader>,local_77 + 1);
  local_77[0] = '\0';
  pJVar2 = JObject::field<char[5],unsigned_long,char>
                     (pJVar2,(char (*) [5])0x2a84d9,
                      (unsigned_long *)
                      &(((sec->io_).
                         super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        )->super_enable_shared_from_this<pstack::Reader>)._M_weak_this.
                       super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                      local_77);
  local_7c = (uint)*(byte *)((long)&((sec->io_).
                                     super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_Reader + 4);
  local_7f[2] = 0;
  pJVar2 = JObject::field<char[5],int,char>
                     (pJVar2,(char (*) [5])0x2a81e6,(int *)&local_7c,local_7f + 2);
  local_7f[1] = 0;
  pJVar2 = JObject::field<char[8],char_const*,char>
                     (pJVar2,(char (*) [8])"binding",
                      (char **)((long)operator<<::bindingNames +
                               (ulong)(*(uint *)((long)&((sec->io_).
                                                                                                                  
                                                  super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->_vptr_Reader + 4) >> 1 & 0x78)),
                      local_7f + 1);
  local_7f[0] = '\0';
  pJVar2 = JObject::field<char[5],char_const*,char>
                     (pJVar2,(char (*) [5])0x2a8a10,
                      operator<<::typeNames +
                      (*(byte *)((long)&((sec->io_).
                                         super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->_vptr_Reader + 4) & 0xf),local_7f);
  local_84 = (uint)*(byte *)((long)&((sec->io_).
                                     super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_Reader + 5);
  local_86[1] = 0;
  pJVar2 = JObject::field<char[6],int,char>
                     (pJVar2,(char (*) [6])"other",(int *)&local_84,local_86 + 1);
  local_86[0] = '\0';
  pJVar2 = JObject::field<char[6],unsigned_short,char>
                     (pJVar2,(char (*) [6])"shndx",
                      (unsigned_short *)
                      ((long)&((sec->io_).
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_Reader + 6),local_86);
  poVar3 = JObject::operator_cast_to_ostream_(pJVar2);
  std::__cxx11::string::~string((string *)(local_68 + 0x10));
  std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)local_68);
  JObject::~JObject(&local_38);
  return poVar3;
}

Assistant:

std::ostream &
operator<< (std::ostream &os, const JSON<Elf::Sym, Elf::Section> &t)
{
    auto &sec = t.context;
    static const char *bindingNames[] = {
        "STB_LOCAL",
        "STB_GLOBAL",
        "STB_WEAK",
        "unknown3",
        "unknown4",
        "unknown5",
        "unknown6",
        "unknown7",
        "unknown8",
        "unknown9",
        "unknowna",
        "unknownb",
        "unknownc",
        "STB_LOPROC",
        "STB_LOPROC + 1",
        "STB_HIPROC + 1",
    };
    static const char *typeNames[] = {
        "STT_NOTYPE",
        "STT_OBJECT",
        "STT_FUNC",
        "STT_SECTION",
        "STT_FILE",
        "STT_5",
        "STT_6",
        "STT_7",
        "STT_8",
        "STT_9",
        "STT_A",
        "STT_B",
        "STT_C",
        "STT_LOPROC",
        "STT_LOPROC + 1",
        "STT_HIPROC"
    };
    auto &symStrings = sec.elf->getLinkedSection(sec);

    return JObject(os)
        .field("name", symStrings.io()->readString(t.object.st_name))
        .field("value", t.object.st_value)
        .field("size",t.object.st_size)
        .field("info", int(t.object.st_info))
        .field("binding", bindingNames[t.object.st_info >> 4])
        .field("type", typeNames[t.object.st_info & 0xf])
        .field("other", int(t.object.st_other))
        .field("shndx", t.object.st_shndx);
}